

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_CallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  CallFlags flags;
  Var value;
  RecyclableObject *function;
  AuxArray<unsigned_int> *spreadIndices;
  
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                 ).super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                                 Function * 8 + 0x160);
  ValidateRegValue(this,value,true,true);
  function = JavascriptOperators::GetCallableObjectOrThrow(value,*(ScriptContext **)(this + 0x78));
  flags = playout->callFlags;
  if (((playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    spreadIndices = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    spreadIndices =
         ByteCodeReader::ReadAuxArray<unsigned_int>
                   ((playout->
                    super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                    SpreadAuxOffset,*(FunctionBody **)(this + 0x88));
  }
  OP_CallCommon<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (this,playout,function,flags,spreadIndices);
  return;
}

Assistant:

void OP_ProfiledCallI(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, playout->profileId); }